

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall
BackwardPass::ProcessSymUse(BackwardPass *this,Sym *sym,bool isRegOpndUse,BOOLEAN isNonByteCodeUse)

{
  BasicBlock *pBVar1;
  bool bVar2;
  PropertySym *propertySym_00;
  StackSym *stackSym;
  PropertySym *propertySym;
  BasicBlock *block;
  BOOLEAN isNonByteCodeUse_local;
  bool isRegOpndUse_local;
  Sym *sym_local;
  BackwardPass *this_local;
  
  pBVar1 = this->currentBlock;
  bVar2 = CanDeadStoreInstrForScopeObjRemoval(this,sym);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = Sym::IsPropertySym(sym);
    if (bVar2) {
      propertySym_00 = Sym::AsPropertySym(sym);
      ProcessStackSymUse(this,propertySym_00->m_stackSym,isNonByteCodeUse);
      bVar2 = IsCollectionPass(this);
      if (bVar2) {
        this_local._7_1_ = true;
      }
      else {
        bVar2 = DoDeadStoreSlots(this);
        if (bVar2) {
          BVSparse<Memory::JitArenaAllocator>::Clear
                    (pBVar1->slotDeadStoreCandidates,(propertySym_00->super_Sym).m_id);
        }
        if (this->tag == BackwardPhase) {
          this_local._7_1_ = ProcessPropertySymUse(this,propertySym_00);
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      stackSym = Sym::AsStackSym(sym);
      this_local._7_1_ = ProcessStackSymUse(this,stackSym,isNonByteCodeUse);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
BackwardPass::ProcessSymUse(Sym * sym, bool isRegOpndUse, BOOLEAN isNonByteCodeUse)
{
    BasicBlock * block = this->currentBlock;

    if (CanDeadStoreInstrForScopeObjRemoval(sym))
    {
        return false;
    }

    if (sym->IsPropertySym())
    {
        PropertySym * propertySym = sym->AsPropertySym();
        ProcessStackSymUse(propertySym->m_stackSym, isNonByteCodeUse);

        if(IsCollectionPass())
        {
            return true;
        }

        if (this->DoDeadStoreSlots())
        {
            block->slotDeadStoreCandidates->Clear(propertySym->m_id);
        }

        if (tag == Js::BackwardPhase)
        {
            // Backward phase tracks liveness of fields to tell GlobOpt where we may need bailout.
            return this->ProcessPropertySymUse(propertySym);
        }
        else
        {
            // Dead-store phase tracks copy propped syms, so it only cares about ByteCodeUses we inserted,
            // not live fields.
            return false;
        }
    }

    return ProcessStackSymUse(sym->AsStackSym(), isNonByteCodeUse);
}